

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_signal.cpp
# Opt level: O3

int __thiscall
CsSignal::SignalBase::internal_cntConnections
          (SignalBase *this,SlotBase *receiver,BentoAbstract *signalMethod_Bento)

{
  undefined1 *puVar1;
  byte bVar2;
  __pointer_type pzVar3;
  long *plVar5;
  int iVar6;
  bool bVar7;
  read_handle senderListHandle;
  read_handle local_40;
  __pointer_type pzVar4;
  
  local_40.m_ptr = &(this->m_connectList).m_obj;
  local_40.m_accessed = false;
  local_40.m_guard.m_list = local_40.m_ptr;
  local_40.m_guard.m_zombie = (zombie_list_node *)operator_new(0x18);
  iVar6 = 0;
  ((local_40.m_guard.m_zombie)->next)._M_b._M_p = (__pointer_type)0x0;
  ((local_40.m_guard.m_zombie)->owner)._M_b._M_p = &local_40.m_guard;
  (local_40.m_guard.m_zombie)->zombie_node = (node *)0x0;
  pzVar4 = *(__pointer_type *)&(this->m_connectList).field_0x10;
  ((local_40.m_guard.m_zombie)->next)._M_b._M_p = pzVar4;
  while( true ) {
    puVar1 = &(this->m_connectList).field_0x10;
    LOCK();
    pzVar3 = *(__pointer_type *)puVar1;
    bVar7 = pzVar4 == pzVar3;
    if (bVar7) {
      *(zombie_list_node **)puVar1 = local_40.m_guard.m_zombie;
      pzVar3 = pzVar4;
    }
    UNLOCK();
    if (bVar7) break;
    ((local_40.m_guard.m_zombie)->next)._M_b._M_p = pzVar3;
    pzVar4 = pzVar3;
  }
  local_40.m_accessed = true;
  plVar5 = *(long **)local_40.m_ptr;
  if (plVar5 != (long *)0x0) {
    iVar6 = 0;
    do {
      if ((receiver == (SlotBase *)0x0) || ((SlotBase *)plVar5[4] == receiver)) {
        bVar2 = (**(code **)(*(long *)plVar5[3] + 0x10))((long *)plVar5[3],signalMethod_Bento);
        iVar6 = iVar6 + (uint)bVar2;
      }
      plVar5 = (long *)*plVar5;
    } while (plVar5 != (long *)0x0);
  }
  libguarded::
  rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
  ::read_handle::~read_handle(&local_40);
  return iVar6;
}

Assistant:

int CsSignal::SignalBase::internal_cntConnections(const SlotBase *receiver,
                  const Internal::BentoAbstract &signalMethod_Bento) const
{
   int retval = 0;

   auto senderListHandle = m_connectList.lock_read();

   for (auto &item : *senderListHandle) {

      if (receiver && item.receiver != receiver) {
         continue;
      }

      if (*(item.signalMethod) != signalMethod_Bento)  {
         continue;
      }

      retval++;
   }

   return retval;
}